

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_render_passes
          (Impl *this,StateCreatorInterface *iface,Value *passes)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  undefined8 uVar1;
  ulonglong uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ConstMemberIterator CVar6;
  Ch *__nptr;
  size_type sVar7;
  Type pGVar8;
  Number NVar9;
  mapped_type *ppVVar10;
  ulong uVar11;
  size_t size;
  void *pvVar12;
  Pointer this_01;
  bool bVar13;
  Hash hash;
  Data local_70;
  ulonglong local_60;
  StateCreatorInterface *local_58;
  void *local_50;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  Value *local_40;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  local_70.o.members = (Member *)this;
  local_58 = iface;
  if ((passes->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x49a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::MemberCount() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar11 = (ulong)(passes->data_).s.length;
  if (uVar11 == 0) {
    local_50 = (void *)0x0;
  }
  else {
    size = uVar11 << 6;
    local_50 = ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (local_50 != (void *)0x0) {
      memset(local_50,0,size);
    }
  }
  if ((passes->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x4d8,
                  "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  this_01 = (Pointer)((ulong)(passes->data_).s.str & 0xffffffffffff);
  CVar6 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberEnd(passes);
  bVar13 = CVar6.ptr_ == this_01;
  if (!bVar13) {
    local_38 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)((long)&((local_70.o.members)->name).data_ + 8);
    local_48 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)(local_70.s.str + 0xe8);
    uVar11 = 0;
    local_40 = passes;
    do {
      __nptr = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(&this_01->name);
      local_60 = strtoull(__nptr,(char **)0x0,0x10);
      sVar7 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(local_38,&local_60);
      pvVar12 = local_50;
      bVar4 = 0;
      if (sVar7 == 0) {
        this_00 = &this_01->value;
        *(undefined4 *)((long)local_50 + uVar11 * 0x40) = 0x26;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"flags");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) {
          __assert_fail("data_.f.flags & kUintFlag",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                        ,0x719,
                        "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        pvVar12 = (void *)(uVar11 * 0x40 + (long)pvVar12);
        *(SizeType *)((long)pvVar12 + 0x10) = (pGVar8->data_).s.length;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_70.s,(Ch *)this_00);
        uVar1 = local_70.n;
        NVar9.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_00);
        if (uVar1 != NVar9.i64) {
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"attachments");
          if ((pGVar8->data_).f.flags != 4) goto LAB_0015395b;
          *(SizeType *)((long)pvVar12 + 0x14) = (pGVar8->data_).s.length;
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"attachments");
          parse_render_pass_attachments
                    ((Impl *)local_70.o.members,pGVar8,
                     (VkAttachmentDescription **)((long)pvVar12 + 0x18));
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_70.s,(Ch *)this_00);
        uVar1 = local_70.n;
        NVar9.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_00);
        if (uVar1 != NVar9.i64) {
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"dependencies");
          if ((pGVar8->data_).f.flags != 4) goto LAB_0015395b;
          *(SizeType *)((long)pvVar12 + 0x30) = (pGVar8->data_).s.length;
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"dependencies");
          parse_render_pass_dependencies
                    ((Impl *)local_70.o.members,pGVar8,
                     (VkSubpassDependency **)((long)pvVar12 + 0x38));
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_70.s,(Ch *)this_00);
        uVar1 = local_70.n;
        NVar9.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_00);
        if (uVar1 != NVar9.i64) {
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"subpasses");
          if ((pGVar8->data_).f.flags != 4) {
LAB_0015395b:
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x66a,
                          "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          *(SizeType *)((long)pvVar12 + 0x20) = (pGVar8->data_).s.length;
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"subpasses");
          parse_render_pass_subpasses
                    ((Impl *)local_70.o.members,pGVar8,
                     (VkSubpassDescription **)((long)pvVar12 + 0x28));
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_70.s,(Ch *)this_00);
        uVar1 = local_70.n;
        NVar9.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_00);
        passes = local_40;
        if (uVar1 != NVar9.i64) {
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"pNext");
          bVar3 = parse_pnext_chain((Impl *)local_70.o.members,pGVar8,(void **)((long)pvVar12 + 8),
                                    (StateCreatorInterface *)0x0,(DatabaseInterface *)0x0,
                                    (Value *)0x0);
          bVar4 = 1;
          if (!bVar3) goto LAB_00153918;
        }
        uVar2 = local_60;
        ppVVar10 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_48,&local_60);
        iVar5 = (*local_58->_vptr_StateCreatorInterface[9])(local_58,uVar2,pvVar12,ppVVar10);
        bVar4 = (byte)iVar5 ^ 1;
      }
LAB_00153918:
      if ((bVar4 & 3) != 0) {
        return bVar13;
      }
      this_01 = this_01 + 1;
      uVar11 = (ulong)((int)uVar11 + 1);
      CVar6 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::MemberEnd(passes);
      bVar13 = this_01 == CVar6.ptr_;
    } while (!bVar13);
  }
  (*local_58->_vptr_StateCreatorInterface[0x11])();
  return bVar13;
}

Assistant:

bool StateReplayer::Impl::parse_render_passes(StateCreatorInterface &iface, const Value &passes)
{
	auto *infos = allocator.allocate_n_cleared<VkRenderPassCreateInfo>(passes.MemberCount());

	unsigned index = 0;
	for (auto itr = passes.MemberBegin(); itr != passes.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_samplers.count(hash))
			continue;
		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;

		info.flags = obj["flags"].GetUint();

		if (obj.HasMember("attachments"))
		{
			info.attachmentCount = obj["attachments"].Size();
			if (!parse_render_pass_attachments(obj["attachments"], &info.pAttachments))
				return false;
		}

		if (obj.HasMember("dependencies"))
		{
			info.dependencyCount = obj["dependencies"].Size();
			if (!parse_render_pass_dependencies(obj["dependencies"], &info.pDependencies))
				return false;
		}

		if (obj.HasMember("subpasses"))
		{
			info.subpassCount = obj["subpasses"].Size();
			if (!parse_render_pass_subpasses(obj["subpasses"], &info.pSubpasses))
				return false;
		}

		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &info.pNext))
				return false;

		if (!iface.enqueue_create_render_pass(hash, &info, &replayed_render_passes[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}